

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZTransform<double> * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
BuildTransform2(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
                *this,int side,TPZGeoEl *father,TPZTransform<double> *t)

{
  uint uVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *in_RCX;
  uint in_EDX;
  TPZGeoEl *in_RSI;
  TPZTransform<double> *in_RDI;
  int son;
  TPZGeoElSide fathloc;
  TPZGeoEl *myfather;
  TPZTransform<double> *trans;
  TPZTransform<double> *in_stack_fffffffffffffc18;
  TPZTransform<double> *in_stack_fffffffffffffc20;
  TPZTransform<double> *this_00;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  TPZTransform<double> *this_01;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  TPZTransform<double> *in_stack_fffffffffffffc60;
  TPZGeoElSide local_48;
  TPZTransform<double> *local_30;
  TPZGeoEl *local_20;
  uint local_14;
  
  if (in_RSI == in_RCX) {
    TPZTransform<double>::TPZTransform
              (in_RDI,(TPZTransform<double> *)
                      CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    this_01 = in_RDI;
  }
  else {
    this_01 = in_RDI;
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_30 = (TPZTransform<double> *)TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffc20);
    if ((((int)local_14 < 0) || (6 < (int)local_14)) || (local_30 == (TPZTransform<double> *)0x0)) {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n");
      TPZTransform<double>::TPZTransform
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
    }
    else {
      (**(code **)(*(long *)in_RSI + 0x248))(&local_48,in_RSI,local_14);
      uVar1 = TPZGeoEl::WhichSubel
                        ((TPZGeoEl *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      (*(local_30->super_TPZSavable)._vptr_TPZSavable[0x3d])
                (in_RDI,local_30,(ulong)local_14,(ulong)uVar1);
      TPZTransform<double>::Multiply(this_01,in_RDI);
      TPZTransform<double>::operator=(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17dff9d);
      pTVar2 = TPZGeoElSide::Element(&local_48);
      if (pTVar2 != local_20) {
        this_00 = local_30;
        uVar1 = TPZGeoElSide::Side(&local_48);
        (*(this_00->super_TPZSavable)._vptr_TPZSavable[0x4b])
                  (&stack0xfffffffffffffc58,this_00,(ulong)uVar1,local_20,in_RDI);
        TPZTransform<double>::operator=(this_00,in_stack_fffffffffffffc18);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x17e0094);
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17e00ea);
    }
  }
  return this_01;
}

Assistant:

TPZTransform<>
TPZGeoElRefLess<TGeo>::BuildTransform2(int side, TPZGeoEl * father, TPZTransform<> &t)
{
	if(this == father) return t;
	TPZGeoEl *myfather = Father();
	if(side<0 || side>(TGeo::NSides-1) || !myfather){
		PZError << "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n";
		return TPZTransform<>(0,0);
	}
	TPZGeoElSide fathloc = Father2(side);
	int son = WhichSubel();
	TPZTransform<> trans=myfather->GetTransform(side,son);
	trans = trans.Multiply(t);
	if(fathloc.Element() == father) return trans;
	trans = myfather->BuildTransform2(fathloc.Side(),father,trans);
	return trans;
}